

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O0

void __thiscall cab_session::send_request(cab_session *this,request *request)

{
  anon_class_24_2_3fe5b907 local_80;
  buffer local_58;
  const_buffer local_40;
  undefined1 local_30 [8];
  shared_ptr<cab_session> self;
  external_add_request_message add_message;
  request *request_local;
  cab_session *this_local;
  
  self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_1_ =
       ::request::src(request);
  self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       ::request::dst(request);
  self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       ::request::passengers(request);
  std::enable_shared_from_this<cab_session>::shared_from_this
            ((enable_shared_from_this<cab_session> *)local_30);
  basic_message<external_add_request_message,_(message_id)69>::to_buffer
            (&local_58,
             (basic_message<external_add_request_message,_(message_id)69> *)
             ((long)&self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 2));
  local_40 = (const_buffer)
             boost::asio::buffer<unsigned_char,std::allocator<unsigned_char>>(&local_58);
  local_80.this = this;
  std::shared_ptr<cab_session>::shared_ptr(&local_80.self,(shared_ptr<cab_session> *)local_30);
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::async_send<boost::asio::const_buffers_1,cab_session::send_request(request&)::__0>
            ((basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->_socket,(const_buffers_1 *)&local_40,&local_80);
  send_request(request&)::$_0::~__0((__0 *)&local_80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
  std::shared_ptr<cab_session>::~shared_ptr((shared_ptr<cab_session> *)local_30);
  return;
}

Assistant:

void cab_session::send_request(request& request)
{
    external_add_request_message add_message;
    add_message.src = static_cast<std::uint8_t>(request.src());
    add_message.dst = static_cast<std::uint8_t>(request.dst());
    add_message.passengers = request.passengers();

    auto self = shared_from_this();
    _socket.async_send(boost::asio::buffer(add_message.to_buffer()), [this, self](boost::system::error_code error_code, std::size_t written)
    {
        std::cout << "Data sent " << written << std::endl;
    });
}